

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O3

void duckdb::ListFilterFunctor::AppendResult
               (Vector *result,Vector *lambda_vector,idx_t elem_cnt,list_entry_t *result_entries,
               ListFilterInfo *info,LambdaExecuteInfo *execute_info)

{
  idx_t iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  pointer puVar4;
  reference pvVar5;
  reference other;
  idx_t iVar6;
  size_type sVar7;
  idx_t count;
  idx_t iVar8;
  SelectionVector sel;
  UnifiedVectorFormat lambda_data;
  Vector result_lists;
  SelectionVector local_f8;
  UnifiedVectorFormat local_e0;
  Vector local_98;
  
  SelectionVector::SelectionVector(&local_f8,elem_cnt);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_e0);
  Vector::ToUnifiedFormat(lambda_vector,elem_cnt,&local_e0);
  if (elem_cnt == 0) {
    count = 0;
  }
  else {
    count = 0;
    iVar8 = 0;
    do {
      iVar6 = iVar8;
      if ((local_e0.sel)->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)(local_e0.sel)->sel_vector[iVar8];
      }
      puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sVar7 = info->row_idx;
      while ((sVar7 < (ulong)((long)puVar4 -
                              (long)(info->entry_lengths).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) &&
             (pvVar5 = vector<unsigned_long,_true>::operator[](&info->entry_lengths,sVar7),
             *pvVar5 == 0))) {
        iVar1 = info->row_idx;
        result_entries[iVar1].offset = info->offset;
        result_entries[iVar1].length = 0;
        sVar7 = iVar1 + 1;
        info->row_idx = sVar7;
        puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      if (((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar6 >> 6]
            >> (iVar6 & 0x3f) & 1) != 0)) && (local_e0.data[iVar6] == '\x01')) {
        local_f8.sel_vector[count] = (sel_t)iVar8;
        count = count + 1;
        info->length = info->length + 1;
      }
      info->src_length = info->src_length + 1;
      pvVar5 = vector<unsigned_long,_true>::operator[](&info->entry_lengths,info->row_idx);
      if (*pvVar5 == info->src_length) {
        uVar2 = info->offset;
        iVar6 = info->row_idx;
        result_entries[iVar6].offset = uVar2;
        uVar3 = info->length;
        result_entries[iVar6].length = uVar3;
        info->offset = uVar3 + uVar2;
        info->row_idx = iVar6 + 1;
        info->length = 0;
        info->src_length = 0;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != elem_cnt);
  }
  puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar7 = info->row_idx;
  while ((sVar7 < (ulong)((long)puVar4 -
                          (long)(info->entry_lengths).
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) &&
         (pvVar5 = vector<unsigned_long,_true>::operator[](&info->entry_lengths,sVar7), *pvVar5 == 0
         ))) {
    iVar8 = info->row_idx;
    result_entries[iVar8].offset = info->offset;
    result_entries[iVar8].length = 0;
    sVar7 = iVar8 + 1;
    info->row_idx = sVar7;
    puVar4 = (info->entry_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  other = vector<duckdb::Vector,_true>::operator[]
                    (&(execute_info->input_chunk).data,(ulong)execute_info->has_index);
  Vector::Vector(&local_98,other,&local_f8,count);
  ListVector::Append(result,&local_98,count,0);
  if (local_98.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.buffer.internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&local_98.type);
  if (local_e0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_f8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void AppendResult(Vector &result, Vector &lambda_vector, const idx_t elem_cnt, list_entry_t *result_entries,
	                         ListFilterInfo &info, LambdaExecuteInfo &execute_info) {

		idx_t count = 0;
		SelectionVector sel(elem_cnt);
		UnifiedVectorFormat lambda_data;
		lambda_vector.ToUnifiedFormat(elem_cnt, lambda_data);

		auto lambda_values = UnifiedVectorFormat::GetData<bool>(lambda_data);
		auto &lambda_validity = lambda_data.validity;

		// compute the new lengths and offsets, and create a selection vector
		for (idx_t i = 0; i < elem_cnt; i++) {
			auto entry_idx = lambda_data.sel->get_index(i);

			// set length and offset of empty lists
			while (info.row_idx < info.entry_lengths.size() && !info.entry_lengths[info.row_idx]) {
				result_entries[info.row_idx].offset = info.offset;
				result_entries[info.row_idx].length = 0;
				info.row_idx++;
			}

			// found a true value
			if (lambda_validity.RowIsValid(entry_idx) && lambda_values[entry_idx]) {
				sel.set_index(count++, i);
				info.length++;
			}

			info.src_length++;

			// we traversed the entire source list
			if (info.entry_lengths[info.row_idx] == info.src_length) {
				// set the offset and length of the result entry
				result_entries[info.row_idx].offset = info.offset;
				result_entries[info.row_idx].length = info.length;

				// reset all other fields
				info.offset += info.length;
				info.row_idx++;
				info.length = 0;
				info.src_length = 0;
			}
		}

		// set length and offset of all remaining empty lists
		while (info.row_idx < info.entry_lengths.size() && !info.entry_lengths[info.row_idx]) {
			result_entries[info.row_idx].offset = info.offset;
			result_entries[info.row_idx].length = 0;
			info.row_idx++;
		}

		// slice the input chunk's corresponding vector to get the new lists
		// and append them to the result
		idx_t source_list_idx = execute_info.has_index ? 1 : 0;
		Vector result_lists(execute_info.input_chunk.data[source_list_idx], sel, count);
		ListVector::Append(result, result_lists, count, 0);
	}